

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O3

bool __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_true>::AtQuantifier
          (Parser<UTF8EncodingPolicyBase<false>,_true> *this)

{
  byte *pbVar1;
  byte bVar2;
  code *pcVar3;
  int iVar4;
  CharCount n;
  bool bVar5;
  EncodedChar EVar6;
  int iVar7;
  undefined4 *puVar8;
  ulong uVar9;
  ulong uVar10;
  byte *pbVar11;
  
  pbVar11 = this->next;
  if (this->inputLim < pbVar11) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
    if (!bVar5) goto LAB_00ed5c8c;
    *puVar8 = 0;
    pbVar11 = this->next;
  }
  bVar2 = *pbVar11;
  if (bVar2 - 0x2a < 2) {
    return true;
  }
  if (bVar2 == 0x3f) {
    return true;
  }
  if (bVar2 == 0x7b) {
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    uVar9 = 1;
    do {
      uVar10 = uVar9;
      iVar4 = (int)uVar10;
      uVar9 = (ulong)(iVar4 + 1);
      if (this->inputLim < pbVar11 + uVar9) break;
      if (this->inputLim < pbVar11 + uVar10) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar8 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar5) goto LAB_00ed5c8c;
        *puVar8 = 0;
        pbVar11 = this->next;
      }
    } while ((ASCIIChars::classes[pbVar11[uVar10]] & 0x10) != 0);
    if ((iVar4 != 1) && (pbVar11 + uVar9 <= this->inputLim)) {
      if (this->inputLim < pbVar11 + uVar10) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar8 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar5) {
LAB_00ed5c8c:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar8 = 0;
        pbVar11 = this->next;
      }
      if (pbVar11[uVar10] == 0x7d) {
        return true;
      }
      if (pbVar11[uVar10] == 0x2c) {
        if (pbVar11 + (iVar4 + 2) <= this->inputLim) {
          EVar6 = ECLookahead(this,iVar4 + 1U);
          if (EVar6 == '}') {
            return true;
          }
          pbVar11 = this->next;
        }
        uVar9 = (ulong)(iVar4 + 1U);
        iVar4 = 0;
        do {
          iVar7 = iVar4;
          n = (CharCount)uVar9;
          uVar10 = (ulong)(n + 1);
          if (this->inputLim < pbVar11 + uVar10) break;
          if (this->inputLim < pbVar11 + uVar9) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar8 = 1;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                               ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
            if (!bVar5) goto LAB_00ed5c8c;
            *puVar8 = 0;
            pbVar11 = this->next;
          }
          pbVar1 = pbVar11 + uVar9;
          uVar9 = uVar10;
          iVar4 = iVar7 + -1;
        } while ((ASCIIChars::classes[*pbVar1] & 0x10) != 0);
        if (iVar7 != 0) {
          if (this->inputLim < pbVar11 + uVar10) {
            return false;
          }
          EVar6 = ECLookahead(this,n);
          return EVar6 == '}';
        }
      }
    }
  }
  return false;
}

Assistant:

bool Parser<P, IsLiteral>::AtQuantifier()
    {
        // Could be terminating 0
        switch (ECLookahead())
        {
        case '*':
        case '+':
        case '?':
            return true;
        case '{':
            {
                CharCount lookahead = 1;
                while (ECCanConsume(lookahead + 1) && standardEncodedChars->IsDigit(ECLookahead(lookahead)))
                    lookahead++;
                if (lookahead == 1 || !ECCanConsume(lookahead + 1))
                    return false;
                switch (ECLookahead(lookahead))
                {
                case ',':
                    lookahead++;
                    if (ECCanConsume(lookahead + 1) && ECLookahead(lookahead) == '}')
                        return true;
                    else
                    {
                        CharCount saved = lookahead;
                        while (ECCanConsume(lookahead + 1) && standardEncodedChars->IsDigit(ECLookahead(lookahead)))
                            lookahead++;
                        if (lookahead == saved)
                            return false;
                        return ECCanConsume(lookahead + 1) && ECLookahead(lookahead) == '}';
                    }
                case '}':
                    return true;
                default:
                    return false;
                }
            }
        default:
            return false;
        }
    }